

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  Var *out_var;
  bool bVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  Enum EVar5;
  Var *this_00;
  string_view name;
  undefined1 local_170 [16];
  string initial_name;
  Location loc;
  string segment_name;
  Var local_100;
  Var local_b8;
  Var local_70;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar3 = Expect(this,Elem);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  initial_name._M_dataplus._M_p = (pointer)&initial_name.field_2;
  initial_name._M_string_length = 0;
  initial_name.field_2._M_local_buf[0] = '\0';
  bVar1 = ParseBindVarOpt(this,&initial_name);
  std::__cxx11::string::string((string *)&segment_name,(string *)&initial_name);
  if ((this->options_->features).bulk_memory_enabled_ == false) {
    std::__cxx11::string::assign((char *)&segment_name);
  }
  std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((Location *)local_170,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
  if (((this->options_->features).reference_types_enabled_ == true) &&
     (bVar2 = Match(this,Declare), bVar2)) {
    *(undefined4 *)(local_170._0_8_ + 0x40) = 2;
  }
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    bVar1 = PeekMatchLpar(this,Table);
    if (!bVar1) {
      this_00 = &local_70;
LAB_0017e2c9:
      out_var = (Var *)(local_170._0_8_ + 0x68);
      Var::Var(this_00,0,&loc);
      ParseVarOpt(this,out_var,this_00);
      goto LAB_0017e2e9;
    }
    RVar3 = Expect(this,Lpar);
    EVar5 = Error;
    if ((((RVar3.enum_ == Error) || (RVar3 = Expect(this,Table), RVar3.enum_ == Error)) ||
        (RVar3 = ParseVar(this,(Var *)(local_170._0_8_ + 0x68)), RVar3.enum_ == Error)) ||
       (RVar3 = Expect(this,Rpar), RVar3.enum_ == Error)) goto LAB_0017e3f0;
  }
  else {
    if (!bVar1) {
      this_00 = &local_100;
      goto LAB_0017e2c9;
    }
    this_00 = &local_b8;
    name._M_str = initial_name._M_dataplus._M_p;
    name._M_len = initial_name._M_string_length;
    Var::Var(this_00,name,&loc);
    Var::operator=((Var *)(local_170._0_8_ + 0x68),this_00);
LAB_0017e2e9:
    Var::~Var(this_00);
  }
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    if (((int)*(long *)(local_170._0_8_ + 0x40) != 2) &&
       (bVar1 = ParseOffsetExprOpt(this,(ExprList *)(local_170._0_8_ + 0xb8)), !bVar1)) {
      *(undefined4 *)(local_170._0_8_ + 0x40) = 1;
    }
LAB_0017e33d:
    bVar1 = ParseRefTypeOpt(this,(Type *)(local_170._0_8_ + 0xb0));
    if (bVar1) {
      ParseElemExprListOpt(this,(ExprListVector *)(local_170._0_8_ + 0xd0));
    }
    else {
      *(long *)(local_170._0_8_ + 0xb0) = 0xfffffff0;
      TVar4 = Peek(this,0);
      if ((TVar4 == First_RefKind) && (RVar3 = Expect(this,First_RefKind), RVar3.enum_ == Error))
      goto LAB_0017e3b7;
      ParseElemExprVarListOpt(this,(ExprListVector *)(local_170._0_8_ + 0xd0));
    }
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ != Error) {
      local_170._8_8_ = local_170._0_8_;
      local_170._0_8_ = (long *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)(local_170 + 8));
      if ((long *)local_170._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_170._8_8_ + 8))();
      }
      local_170._8_8_ = (char *)0x0;
      EVar5 = Ok;
      goto LAB_0017e3f0;
    }
  }
  else {
    RVar3 = ParseOffsetExpr(this,(ExprList *)(local_170._0_8_ + 0xb8));
    if (RVar3.enum_ != Error) goto LAB_0017e33d;
  }
LAB_0017e3b7:
  EVar5 = Error;
LAB_0017e3f0:
  if ((long *)local_170._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_170._0_8_ + 8))();
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);

  // With MVP text format the name here was intended to refer to the table
  // that the elem segment was part of, but we never did anything with this name
  // since there was only one table anyway.
  // With bulk-memory enabled this introduces a new name for the particular
  // elem segment.
  std::string initial_name;
  bool has_name = ParseBindVarOpt(&initial_name);

  std::string segment_name = initial_name;
  if (!options_->features.bulk_memory_enabled()) {
    segment_name = "";
  }
  auto field = std::make_unique<ElemSegmentModuleField>(loc, segment_name);
  if (options_->features.reference_types_enabled() &&
      Match(TokenType::Declare)) {
    field->elem_segment.kind = SegmentKind::Declared;
  }

  // Optional table specifier
  if (options_->features.bulk_memory_enabled()) {
    if (PeekMatchLpar(TokenType::Table)) {
      EXPECT(Lpar);
      EXPECT(Table);
      CHECK_RESULT(ParseVar(&field->elem_segment.table_var));
      EXPECT(Rpar);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  } else {
    if (has_name) {
      field->elem_segment.table_var = Var(initial_name, loc);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  }

  // Parse offset expression, if not declared/passive segment.
  if (options_->features.bulk_memory_enabled()) {
    if (field->elem_segment.kind != SegmentKind::Declared &&
        !ParseOffsetExprOpt(&field->elem_segment.offset)) {
      field->elem_segment.kind = SegmentKind::Passive;
    }
  } else {
    CHECK_RESULT(ParseOffsetExpr(&field->elem_segment.offset));
  }

  if (ParseRefTypeOpt(&field->elem_segment.elem_type)) {
    ParseElemExprListOpt(&field->elem_segment.elem_exprs);
  } else {
    field->elem_segment.elem_type = Type::FuncRef;
    if (PeekMatch(TokenType::Func)) {
      EXPECT(Func);
    }
    ParseElemExprVarListOpt(&field->elem_segment.elem_exprs);
  }
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}